

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O0

void cmExtraEclipseCDT4Generator::AppendStorageScanners(cmXMLWriter *xml,cmMakefile *makefile)

{
  cmMakefile *pcVar1;
  string *psVar2;
  string *psVar3;
  ulong uVar4;
  allocator<char> local_2e1;
  string local_2e0;
  allocator<char> local_2b9;
  string local_2b8;
  allocator<char> local_291;
  string local_290;
  allocator<char> local_269;
  string local_268;
  allocator<char> local_241;
  string local_240;
  allocator<char> local_219;
  string local_218;
  allocator<char> local_1f1;
  string local_1f0;
  allocator<char> local_1c9;
  string local_1c8;
  allocator<char> local_1a1;
  string local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  allocator<char> local_159;
  undefined1 local_158 [8];
  string compilerArgs;
  string local_130;
  allocator<char> local_109;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  undefined1 local_c0 [8];
  string arg1;
  string local_98;
  undefined1 local_78 [8];
  string compiler;
  allocator<char> local_41;
  string local_40;
  string *local_20;
  string *make;
  cmMakefile *makefile_local;
  cmXMLWriter *xml_local;
  
  make = (string *)makefile;
  makefile_local = (cmMakefile *)xml;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"CMAKE_MAKE_PROGRAM",&local_41);
  psVar2 = cmMakefile::GetRequiredDefinition(makefile,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  psVar3 = make;
  local_20 = psVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"CMAKE_C_COMPILER",
             (allocator<char> *)(arg1.field_2._M_local_buf + 0xf));
  psVar3 = cmMakefile::GetSafeDefinition((cmMakefile *)psVar3,&local_98);
  std::__cxx11::string::string((string *)local_78,(string *)psVar3);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)(arg1.field_2._M_local_buf + 0xf));
  psVar3 = make;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"CMAKE_C_COMPILER_ARG1",&local_e1);
  psVar3 = cmMakefile::GetSafeDefinition((cmMakefile *)psVar3,&local_e0);
  std::__cxx11::string::string((string *)local_c0,(string *)psVar3);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  uVar4 = std::__cxx11::string::empty();
  psVar3 = make;
  if ((uVar4 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,"CMAKE_CXX_COMPILER",&local_109);
    psVar3 = cmMakefile::GetSafeDefinition((cmMakefile *)psVar3,&local_108);
    std::__cxx11::string::operator=((string *)local_78,(string *)psVar3);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator(&local_109);
    psVar3 = make;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,"CMAKE_CXX_COMPILER_ARG1",
               (allocator<char> *)(compilerArgs.field_2._M_local_buf + 0xf));
    psVar3 = cmMakefile::GetSafeDefinition((cmMakefile *)psVar3,&local_130);
    std::__cxx11::string::operator=((string *)local_c0,(string *)psVar3);
    std::__cxx11::string::~string((string *)&local_130);
    std::allocator<char>::~allocator((allocator<char> *)(compilerArgs.field_2._M_local_buf + 0xf));
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) != 0) {
    std::__cxx11::string::operator=((string *)local_78,"gcc");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_158,"-E -P -v -dD ${plugin_state_location}/${specs_file}",&local_159);
  std::allocator<char>::~allocator(&local_159);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)local_c0," ");
    std::operator+(&local_180,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158);
    std::__cxx11::string::operator=((string *)local_158,(string *)&local_180);
    std::__cxx11::string::~string((string *)&local_180);
  }
  pcVar1 = makefile_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,"storageModule",&local_1a1);
  cmXMLWriter::StartElement((cmXMLWriter *)pcVar1,&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  cmXMLWriter::Attribute<char[21]>
            ((cmXMLWriter *)makefile_local,"moduleId",(char (*) [21])"scannerConfiguration");
  pcVar1 = makefile_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,"autodiscovery",&local_1c9);
  cmXMLWriter::StartElement((cmXMLWriter *)pcVar1,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  cmXMLWriter::Attribute<char[5]>((cmXMLWriter *)makefile_local,"enabled",(char (*) [5])0x8d04d9);
  cmXMLWriter::Attribute<char[5]>
            ((cmXMLWriter *)makefile_local,"problemReportingEnabled",(char (*) [5])0x8d04d9);
  cmXMLWriter::Attribute<char[59]>
            ((cmXMLWriter *)makefile_local,"selectedProfileId",
             (char (*) [59])"org.eclipse.cdt.make.core.GCCStandardMakePerProjectProfile");
  cmXMLWriter::EndElement((cmXMLWriter *)makefile_local);
  pcVar1 = makefile_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,"org.eclipse.cdt.make.core.GCCStandardMakePerProjectProfile",
             &local_1f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"",&local_219);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"specsFile",&local_241);
  AppendScannerProfile
            ((cmXMLWriter *)pcVar1,&local_1f0,true,&local_218,true,&local_240,(string *)local_158,
             (string *)local_78,true,true);
  std::__cxx11::string::~string((string *)&local_240);
  std::allocator<char>::~allocator(&local_241);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator(&local_219);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator(&local_1f1);
  pcVar1 = makefile_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_268,"org.eclipse.cdt.make.core.GCCStandardMakePerFileProfile",
             &local_269);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"",&local_291);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b8,"makefileGenerator",&local_2b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e0,"-f ${project_name}_scd.mk",&local_2e1);
  AppendScannerProfile
            ((cmXMLWriter *)pcVar1,&local_268,true,&local_290,true,&local_2b8,&local_2e0,local_20,
             true,true);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::allocator<char>::~allocator(&local_2e1);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::allocator<char>::~allocator(&local_2b9);
  std::__cxx11::string::~string((string *)&local_290);
  std::allocator<char>::~allocator(&local_291);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator(&local_269);
  cmXMLWriter::EndElement((cmXMLWriter *)makefile_local);
  std::__cxx11::string::~string((string *)local_158);
  std::__cxx11::string::~string((string *)local_c0);
  std::__cxx11::string::~string((string *)local_78);
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::AppendStorageScanners(
  cmXMLWriter& xml, const cmMakefile& makefile)
{
  // we need the "make" and the C (or C++) compiler which are used, Alex
  const std::string& make =
    makefile.GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  std::string compiler = makefile.GetSafeDefinition("CMAKE_C_COMPILER");
  std::string arg1 = makefile.GetSafeDefinition("CMAKE_C_COMPILER_ARG1");
  if (compiler.empty()) {
    compiler = makefile.GetSafeDefinition("CMAKE_CXX_COMPILER");
    arg1 = makefile.GetSafeDefinition("CMAKE_CXX_COMPILER_ARG1");
  }
  if (compiler.empty()) // Hmm, what to do now ?
  {
    compiler = "gcc";
  }

  // the following right now hardcodes gcc behaviour :-/
  std::string compilerArgs =
    "-E -P -v -dD ${plugin_state_location}/${specs_file}";
  if (!arg1.empty()) {
    arg1 += " ";
    compilerArgs = arg1 + compilerArgs;
  }

  xml.StartElement("storageModule");
  xml.Attribute("moduleId", "scannerConfiguration");

  xml.StartElement("autodiscovery");
  xml.Attribute("enabled", "true");
  xml.Attribute("problemReportingEnabled", "true");
  xml.Attribute("selectedProfileId",
                "org.eclipse.cdt.make.core.GCCStandardMakePerProjectProfile");
  xml.EndElement(); // autodiscovery

  cmExtraEclipseCDT4Generator::AppendScannerProfile(
    xml, "org.eclipse.cdt.make.core.GCCStandardMakePerProjectProfile", true,
    "", true, "specsFile", compilerArgs, compiler, true, true);
  cmExtraEclipseCDT4Generator::AppendScannerProfile(
    xml, "org.eclipse.cdt.make.core.GCCStandardMakePerFileProfile", true, "",
    true, "makefileGenerator", "-f ${project_name}_scd.mk", make, true, true);

  xml.EndElement(); // storageModule
}